

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

string * __thiscall
libtorrent::lsd_peer_alert::message_abi_cxx11_(string *__return_storage_ptr__,lsd_peer_alert *this)

{
  undefined8 uVar1;
  allocator<char> local_109;
  string local_108;
  char local_e8 [8];
  char msg [200];
  lsd_peer_alert *this_local;
  
  peer_alert::message_abi_cxx11_(&local_108,&this->super_peer_alert);
  uVar1 = std::__cxx11::string::c_str();
  snprintf(local_e8,200,"%s: received peer from local service discovery",uVar1);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_e8,&local_109);
  std::allocator<char>::~allocator(&local_109);
  return __return_storage_ptr__;
}

Assistant:

std::string lsd_peer_alert::message() const
	{
		char msg[200];
		std::snprintf(msg, sizeof(msg), "%s: received peer from local service discovery"
			, peer_alert::message().c_str());
		return msg;
	}